

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O2

ostream * rc::operator<<(ostream *os,Random *random)

{
  ostream *poVar1;
  
  std::operator<<(os,"key=");
  detail::showValue<unsigned_long,4ul>(&random->m_key,os);
  std::operator<<(os,", block=");
  detail::showValue<unsigned_long,4ul>(&random->m_block,os);
  poVar1 = std::operator<<(os,", bits=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(os,", counter=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(os,", bitsi=");
  std::ostream::operator<<(poVar1,(uint)random->m_bitsi);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Random &random) {
  os << "key=";
  show(random.m_key, os);
  os << ", block=";
  show(random.m_block, os);
  os << ", bits=" << random.m_bits;
  os << ", counter=" << random.m_counter;
  os << ", bitsi=" << static_cast<int>(random.m_bitsi);
  return os;
}